

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O0

longlong anon_unknown.dwarf_d9833::GetLongPow(longlong number,longlong power)

{
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_28;
  longlong result;
  longlong power_local;
  longlong number_local;
  
  if (power < 0) {
    if (number == 1) {
      local_2c = 1;
    }
    else {
      if (number == -1) {
        local_30 = 1;
        if ((power & 1U) != 0) {
          local_30 = -1;
        }
      }
      else {
        local_30 = 0;
      }
      local_2c = local_30;
    }
    number_local = (longlong)local_2c;
  }
  else {
    local_28 = 1;
    power_local = number;
    for (result = power; result != 0; result = result >> 1) {
      if ((result & 1U) != 0) {
        local_28 = power_local * local_28;
        result = result + -1;
      }
      power_local = power_local * power_local;
    }
    number_local = local_28;
  }
  return number_local;
}

Assistant:

long long GetLongPow(long long number, long long power)
	{
		if(power < 0)
			return number == 1 ? 1 : (number == -1 ? ((power & 1) ? -1 : 1) : 0);

		long long result = 1;
		while(power)
		{
			if(power & 1)
			{
				result *= number;
				power--;
			}
			number *= number;
			power >>= 1;
		}
		return result;
	}